

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

CustomExternalWrapperObject * __thiscall
Js::CustomExternalWrapperObject::Copy(CustomExternalWrapperObject *this,bool deepCopy)

{
  CustomExternalWrapperType *pCVar1;
  JsTraceCallback p_Var2;
  Recycler *pRVar3;
  CustomExternalWrapperObject *pCVar4;
  JsFinalizeCallback p_Var5;
  TrackAllocData local_d0;
  code *local_a8;
  undefined8 local_a0;
  TrackAllocData local_98;
  code *local_70;
  undefined8 local_68;
  TrackAllocData local_60;
  int local_34;
  CustomExternalWrapperType *pCStack_30;
  int inlineSlotSize;
  CustomExternalWrapperType *externalType;
  Recycler *recycler;
  CustomExternalWrapperObject *pCStack_18;
  bool deepCopy_local;
  CustomExternalWrapperObject *this_local;
  
  recycler._7_1_ = deepCopy;
  pCStack_18 = this;
  externalType = (CustomExternalWrapperType *)
                 RecyclableObject::GetRecycler((RecyclableObject *)this);
  pCStack_30 = GetExternalType(this);
  local_34 = GetInlineSlotSize(this);
  p_Var2 = CustomExternalWrapperType::GetJsTraceCallback(pCStack_30);
  pCVar1 = externalType;
  if (p_Var2 == (JsTraceCallback)0x0) {
    p_Var5 = CustomExternalWrapperType::GetJsFinalizeCallback(pCStack_30);
    pCVar1 = externalType;
    if (p_Var5 == (JsFinalizeCallback)0x0) {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_d0,(type_info *)&typeinfo,(long)local_34,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                 ,0x9f);
      pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)pCVar1,&local_d0);
      pCVar4 = (CustomExternalWrapperObject *)new<Memory::Recycler>(0x30,pRVar3,0x446fd0,0);
      CustomExternalWrapperObject(pCVar4,this,(bool)(recycler._7_1_ & 1));
      this_local = pCVar4;
    }
    else {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_98,(type_info *)&typeinfo,(long)local_34,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                 ,0x9b);
      pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)pCVar1,&local_98);
      local_a8 = Memory::Recycler::AllocFinalized;
      local_a0 = 0;
      pCVar4 = (CustomExternalWrapperObject *)new<Memory::Recycler>(0x30,pRVar3,0x48f150,0);
      CustomExternalWrapperObject(pCVar4,this,(bool)(recycler._7_1_ & 1));
      this_local = pCVar4;
    }
  }
  else {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&typeinfo,(long)local_34,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
               ,0x97);
    pRVar3 = Memory::Recycler::TrackAllocInfo((Recycler *)pCVar1,&local_60);
    local_70 = Memory::Recycler::AllocTracked;
    local_68 = 0;
    pCVar4 = (CustomExternalWrapperObject *)new<Memory::Recycler>(0x30,pRVar3,0x48f120,0);
    CustomExternalWrapperObject(pCVar4,this,(bool)(recycler._7_1_ & 1));
    this_local = pCVar4;
  }
  return this_local;
}

Assistant:

CustomExternalWrapperObject* CustomExternalWrapperObject::Copy(bool deepCopy)
{
    Recycler* recycler = this->GetRecycler();
    CustomExternalWrapperType* externalType = this->GetExternalType();
    int inlineSlotSize = this->GetInlineSlotSize();

    if (externalType->GetJsTraceCallback() != nullptr)
    {
        return RecyclerNewTrackedPlus(recycler, inlineSlotSize, CustomExternalWrapperObject, this, deepCopy);
    }
    else if (externalType->GetJsFinalizeCallback() != nullptr)
    {
        return RecyclerNewFinalizedPlus(recycler, inlineSlotSize, CustomExternalWrapperObject, this, deepCopy);
    }
    else
    {
        return RecyclerNewPlus(recycler, inlineSlotSize, CustomExternalWrapperObject, this, deepCopy);
    }
}